

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O1

void __thiscall groundupdbext::HighwayHash::HighwayHash(HighwayHash *this)

{
  HighwayHashCatT<1U> *pHVar1;
  HHResult64 *pHVar2;
  int i;
  long lVar3;
  Lanes rotated_keys;
  ulong local_38 [5];
  
  this->m_key[2] = 3;
  this->m_key[3] = 4;
  *(undefined4 *)this->m_key = 1;
  *(undefined4 *)((long)this->m_key + 4) = 0;
  *(undefined4 *)(this->m_key + 1) = 2;
  *(undefined4 *)((long)this->m_key + 0xc) = 0;
  pHVar1 = (HighwayHashCatT<1U> *)operator_new(0xc0,0x40);
  lVar3 = 0;
  do {
    local_38[lVar3] = this->m_key[lVar3] << 0x20 | this->m_key[lVar3] >> 0x20;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  (pHVar1->state_).mul0[2] = 0x13198a2e03707344;
  (pHVar1->state_).mul0[3] = 0x243f6a8885a308d3;
  (pHVar1->state_).mul0[0] = 0xdbe6d5d5fe4cce2f;
  (pHVar1->state_).mul0[1] = 0xa4093822299f31d0;
  (pHVar1->state_).mul1[0] = 0x3bd39e10cb0ef593;
  (pHVar1->state_).mul1[1] = 0xc0acf169b5f18a8c;
  (pHVar1->state_).mul1[2] = 0xbe5466cf34e90c6c;
  (pHVar1->state_).mul1[3] = 0x452821e638d01377;
  lVar3 = 0;
  do {
    *(ulong *)((long)(pHVar1->state_).v0 + lVar3) =
         *(ulong *)((long)this->m_key + lVar3) ^
         *(ulong *)((long)&highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::
                           init0 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  lVar3 = 0;
  do {
    *(ulong *)((long)(pHVar1->state_).v1 + lVar3) =
         *(ulong *)((long)local_38 + lVar3) ^
         *(ulong *)((long)&highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::
                           init1 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  pHVar1->buffer_usage_ = 0;
  pHVar1->buffer_[0] = '\0';
  pHVar1->buffer_[1] = '\0';
  pHVar1->buffer_[2] = '\0';
  pHVar1->buffer_[3] = '\0';
  pHVar1->buffer_[4] = '\0';
  pHVar1->buffer_[5] = '\0';
  pHVar1->buffer_[6] = '\0';
  pHVar1->buffer_[7] = '\0';
  pHVar1->buffer_[8] = '\0';
  pHVar1->buffer_[9] = '\0';
  pHVar1->buffer_[10] = '\0';
  pHVar1->buffer_[0xb] = '\0';
  pHVar1->buffer_[0xc] = '\0';
  pHVar1->buffer_[0xd] = '\0';
  pHVar1->buffer_[0xe] = '\0';
  pHVar1->buffer_[0xf] = '\0';
  pHVar1->buffer_[0x10] = '\0';
  pHVar1->buffer_[0x11] = '\0';
  pHVar1->buffer_[0x12] = '\0';
  pHVar1->buffer_[0x13] = '\0';
  pHVar1->buffer_[0x14] = '\0';
  pHVar1->buffer_[0x15] = '\0';
  pHVar1->buffer_[0x16] = '\0';
  pHVar1->buffer_[0x17] = '\0';
  pHVar1->buffer_[0x18] = '\0';
  pHVar1->buffer_[0x19] = '\0';
  pHVar1->buffer_[0x1a] = '\0';
  pHVar1->buffer_[0x1b] = '\0';
  pHVar1->buffer_[0x1c] = '\0';
  pHVar1->buffer_[0x1d] = '\0';
  pHVar1->buffer_[0x1e] = '\0';
  pHVar1->buffer_[0x1f] = '\0';
  this->m_hh = pHVar1;
  pHVar2 = (HHResult64 *)operator_new(8);
  *pHVar2 = 0;
  this->m_result = pHVar2;
  return;
}

Assistant:

HighwayHash::HighwayHash()
  : m_key{1,2,3,4},
    m_hh(new HighwayHashCatT<HH_TARGET>(m_key)),
    m_result(new HHResult64())
{
  ;
}